

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhandler.cc
# Opt level: O1

int __thiscall BitDhtHandler::PeerCallback(BitDhtHandler *this,bdId *id,uint32_t status)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  iterator iVar4;
  long lVar5;
  char *pcVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() NodeId: ",0x26);
  bdStdPrintId((ostream *)&std::cerr,id);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  pthread_mutex_lock((pthread_mutex_t *)&this->resultsMtx);
  iVar4 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_BssResult>,_std::_Select1st<std::pair<const_bdNodeId,_BssResult>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_BssResult>_>_>
          ::find(&(this->mSearchNodes)._M_t,&id->id);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->mSearchNodes)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"BitDhtHandler::PeerCallback() Unknown NodeId !!! ",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    goto switchD_00113225_default;
  }
  *(uint32_t *)((long)&iVar4._M_node[2]._M_right + 4) = status;
  switch(status) {
  case 1:
    lVar5 = 0x3a;
    pcVar6 = "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ";
    break;
  case 2:
    lVar5 = 0x3f;
    pcVar6 = "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ";
    break;
  case 3:
    lVar5 = 0x48;
    pcVar6 = "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ";
    goto LAB_0011329d;
  case 4:
    lVar5 = 0x42;
    pcVar6 = "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address";
LAB_0011329d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    *(undefined4 *)((long)&iVar4._M_node[2]._M_left + 4) = *(undefined4 *)((id->id).data + 0x10);
    uVar1 = *(undefined8 *)&id->addr;
    uVar2 = *(undefined8 *)(id->addr).sin_zero;
    uVar3 = *(undefined8 *)((id->id).data + 8);
    *(undefined8 *)&iVar4._M_node[2].field_0x4 = *(undefined8 *)(id->id).data;
    *(undefined8 *)((long)&iVar4._M_node[2]._M_parent + 4) = uVar3;
    *(undefined8 *)((long)&iVar4._M_node[1]._M_left + 4) = uVar1;
    *(undefined8 *)((long)&iVar4._M_node[1]._M_right + 4) = uVar2;
  default:
    goto switchD_00113225_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
switchD_00113225_default:
  pthread_mutex_unlock((pthread_mutex_t *)&this->resultsMtx);
  return 1;
}

Assistant:

int BitDhtHandler::PeerCallback(const bdId *id, uint32_t status) {
	std::cerr << "BitDhtHandler::PeerCallback() NodeId: ";
	bdStdPrintId(std::cerr, id);
	std::cerr << std::endl;

    bdStackMutex stack(resultsMtx); /********** MUTEX LOCKED *************/

	/* find the node from our list */
	std::map<bdNodeId, BssResult>::iterator it;
	it = mSearchNodes.find(id->id);
	if (it == mSearchNodes.end()) {
		std::cerr << "BitDhtHandler::PeerCallback() Unknown NodeId !!! ";
		std::cerr << std::endl;
		return 1;
	}
	it->second.status = status;

	bool connect = false;
	switch(status) {
        case BITDHT_MGR_QUERY_FAILURE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY FAILURE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_OFFLINE:
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER OFFLINE ... do nothin ";
            std::cerr << std::endl;
        break;

        case BITDHT_MGR_QUERY_PEER_UNREACHABLE: {
            /* do nothing */
            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER UNREACHABLE ... saving address ";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
        case BITDHT_MGR_QUERY_PEER_ONLINE: {
            /* do something */

            std::cerr << "BitDhtHandler::PeerCallback() QUERY PEER ONLINE ... saving address";
            std::cerr << std::endl;

            it->second.id = *id;
            break;
        }
	}
	return 1;
}